

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<int,_QList<int>_>_>::moveAppend
          (QGenericArrayOps<std::pair<int,_QList<int>_>_> *this,pair<int,_QList<int>_> *b,
          pair<int,_QList<int>_> *e)

{
  pair<int,_QList<int>_> *ppVar1;
  Data *pDVar2;
  int *piVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    ppVar1 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).ptr;
    qVar5 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
    do {
      ppVar1[qVar5].first = b->first;
      pDVar2 = (b->second).d.d;
      (b->second).d.d = (Data *)0x0;
      ppVar1[qVar5].second.d.d = pDVar2;
      piVar3 = (b->second).d.ptr;
      (b->second).d.ptr = (int *)0x0;
      ppVar1[qVar5].second.d.ptr = piVar3;
      qVar4 = (b->second).d.size;
      (b->second).d.size = 0;
      ppVar1[qVar5].second.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size + 1;
      (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }